

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_coder.c
# Opt level: O0

lzma_ret lzma_simple_coder_init
                   (lzma_next_coder *next,lzma_allocator *allocator,lzma_filter_info *filters,
                   _func_size_t_void_ptr_uint32_t__Bool_uint8_t_ptr_size_t *filter,
                   size_t simple_size,size_t unfiltered_max,uint32_t alignment,_Bool is_encoder)

{
  lzma_ret lVar1;
  lzma_next_coder *__dest;
  void *pvVar2;
  lzma_options_bcj *simple;
  undefined8 local_90;
  lzma_next_coder *local_50;
  lzma_simple_coder *coder;
  size_t sStack_40;
  _Bool is_encoder_local;
  size_t unfiltered_max_local;
  size_t simple_size_local;
  _func_size_t_void_ptr_uint32_t__Bool_uint8_t_ptr_size_t *filter_local;
  lzma_filter_info *filters_local;
  lzma_allocator *allocator_local;
  lzma_next_coder *next_local;
  
  coder._7_1_ = is_encoder;
  local_50 = (lzma_next_coder *)next->coder;
  sStack_40 = unfiltered_max;
  unfiltered_max_local = simple_size;
  simple_size_local = (size_t)filter;
  filter_local = (_func_size_t_void_ptr_uint32_t__Bool_uint8_t_ptr_size_t *)filters;
  filters_local = (lzma_filter_info *)allocator;
  allocator_local = (lzma_allocator *)next;
  if (local_50 == (lzma_next_coder *)0x0) {
    __dest = (lzma_next_coder *)lzma_alloc(unfiltered_max * 2 + 0x88,allocator);
    if (__dest == (lzma_next_coder *)0x0) {
      return LZMA_MEM_ERROR;
    }
    allocator_local->alloc = (_func_void_ptr_void_ptr_size_t_size_t *)__dest;
    allocator_local[1].alloc = simple_code;
    allocator_local[1].free = simple_coder_end;
    allocator_local[2].opaque = simple_coder_update;
    local_50 = __dest;
    memset(&simple,0,0x48);
    local_90 = 0xffffffffffffffff;
    memcpy(__dest,&simple,0x48);
    local_50[1].id = simple_size_local;
    local_50[1].end = (lzma_end_function)(sStack_40 << 1);
    if (unfiltered_max_local == 0) {
      local_50[1].init = 0;
    }
    else {
      pvVar2 = lzma_alloc(unfiltered_max_local,(lzma_allocator *)filters_local);
      local_50[1].init = (uintptr_t)pvVar2;
      if (local_50[1].init == 0) {
        return LZMA_MEM_ERROR;
      }
    }
  }
  if (*(long *)(filter_local + 0x10) == 0) {
    *(undefined4 *)&local_50[1].code = 0;
  }
  else {
    *(undefined4 *)&local_50[1].code = **(undefined4 **)(filter_local + 0x10);
    if ((*(uint *)&local_50[1].code & alignment - 1) != 0) {
      return LZMA_OPTIONS_ERROR;
    }
  }
  *(byte *)((long)&local_50[1].coder + 1) = coder._7_1_ & 1;
  *(undefined1 *)&local_50[1].coder = 0;
  local_50[1].get_progress = (_func_void_void_ptr_uint64_t_ptr_uint64_t_ptr *)0x0;
  local_50[1].get_check = (_func_lzma_check_void_ptr *)0x0;
  local_50[1].memconfig = (_func_lzma_ret_void_ptr_uint64_t_ptr_uint64_t_ptr_uint64_t *)0x0;
  lVar1 = lzma_next_filter_init
                    (local_50,(lzma_allocator *)filters_local,
                     (lzma_filter_info *)(filter_local + 0x18));
  return lVar1;
}

Assistant:

extern lzma_ret
lzma_simple_coder_init(lzma_next_coder *next, const lzma_allocator *allocator,
		const lzma_filter_info *filters,
		size_t (*filter)(void *simple, uint32_t now_pos,
			bool is_encoder, uint8_t *buffer, size_t size),
		size_t simple_size, size_t unfiltered_max,
		uint32_t alignment, bool is_encoder)
{
	// Allocate memory for the lzma_simple_coder structure if needed.
	lzma_simple_coder *coder = next->coder;
	if (coder == NULL) {
		// Here we allocate space also for the temporary buffer. We
		// need twice the size of unfiltered_max, because then it
		// is always possible to filter at least unfiltered_max bytes
		// more data in coder->buffer[] if it can be filled completely.
		coder = lzma_alloc(sizeof(lzma_simple_coder)
				+ 2 * unfiltered_max, allocator);
		if (coder == NULL)
			return LZMA_MEM_ERROR;

		next->coder = coder;
		next->code = &simple_code;
		next->end = &simple_coder_end;
		next->update = &simple_coder_update;

		coder->next = LZMA_NEXT_CODER_INIT;
		coder->filter = filter;
		coder->allocated = 2 * unfiltered_max;

		// Allocate memory for filter-specific data structure.
		if (simple_size > 0) {
			coder->simple = lzma_alloc(simple_size, allocator);
			if (coder->simple == NULL)
				return LZMA_MEM_ERROR;
		} else {
			coder->simple = NULL;
		}
	}

	if (filters[0].options != NULL) {
		const lzma_options_bcj *simple = filters[0].options;
		coder->now_pos = simple->start_offset;
		if (coder->now_pos & (alignment - 1))
			return LZMA_OPTIONS_ERROR;
	} else {
		coder->now_pos = 0;
	}

	// Reset variables.
	coder->is_encoder = is_encoder;
	coder->end_was_reached = false;
	coder->pos = 0;
	coder->filtered = 0;
	coder->size = 0;

	return lzma_next_filter_init(&coder->next, allocator, filters + 1);
}